

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
parser::memo::any::bind<std::__cxx11::string>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  
  if (this->p == (dyn *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*this->p->_vptr_dyn[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar1 == 0) goto LAB_00135ca8;
    }
    return;
  }
LAB_00135ca8:
  std::__cxx11::string::_M_assign((string *)v);
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}